

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Netlist.h
# Opt level: O0

string * __thiscall netlist::VariableRangeSelect::toString_abi_cxx11_(VariableRangeSelect *this)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  bool bVar1;
  RangeSelectionKind RVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string right;
  string left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  SyntaxNode *in_stack_fffffffffffffdb8;
  undefined1 local_218 [112];
  undefined1 local_1a8 [48];
  undefined1 local_178 [32];
  undefined8 local_158;
  undefined1 *local_150;
  char *local_148;
  undefined8 uStack_140;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  undefined8 uStack_118;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined8 uStack_d0;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 local_98 [32];
  undefined8 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  unsigned_long_long in_stack_ffffffffffffffb0;
  undefined1 *puVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_ffffffffffffffb8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar4;
  char *in_stack_ffffffffffffffc0;
  char *pcVar5;
  size_t in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  
  x = in_RDI;
  std::__cxx11::string::string(in_RSI);
  bVar1 = leftIndexIsConstant((VariableRangeSelect *)0x1a1378);
  if (bVar1) {
    slang::ConstantValue::toString_abi_cxx11_
              ((ConstantValue *)x,(bitwidth_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)
               ,SUB81((ulong)in_RDI >> 0x10,0));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(in_RDI);
  }
  else {
    slang::ast::RangeSelectExpression::left
              ((RangeSelectExpression *)(in_RSI->field_2)._M_allocated_capacity);
    slang::syntax::SyntaxNode::toString_abi_cxx11_(in_stack_fffffffffffffdb8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(in_RDI);
  }
  std::__cxx11::string::string(in_RSI);
  bVar1 = rightIndexIsConstant((VariableRangeSelect *)0x1a1442);
  if (bVar1) {
    slang::ConstantValue::toString_abi_cxx11_
              ((ConstantValue *)x,(bitwidth_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)
               ,SUB81((ulong)in_RDI >> 0x10,0));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(in_RDI);
  }
  else {
    slang::ast::RangeSelectExpression::right
              ((RangeSelectExpression *)(in_RSI->field_2)._M_allocated_capacity);
    slang::syntax::SyntaxNode::toString_abi_cxx11_(in_stack_fffffffffffffdb8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    std::__cxx11::string::~string(in_RDI);
  }
  RVar2 = slang::ast::RangeSelectExpression::getSelectionKind
                    ((RangeSelectExpression *)(in_RSI->field_2)._M_allocated_capacity);
  if (RVar2 == Simple) {
    aVar4.values_ = (value<fmt::v11::context> *)0xb10ea4;
    pcVar5 = (char *)0x7;
    puVar3 = local_1a8;
    local_58 = local_218;
    local_68 = "[{}:{}]";
    uStack_60 = 7;
    pbVar6 = in_RDI;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RSI,x);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RSI,x);
    local_70 = local_98;
    local_78 = 0xdd;
    fmt.size_ = (size_t)pbVar6;
    fmt.data_ = pcVar5;
    args.field_1.values_ = aVar4.values_;
    args.desc_ = (unsigned_long_long)puVar3;
    ::fmt::v11::vformat_abi_cxx11_(fmt,args);
  }
  else if (RVar2 == IndexedUp) {
    local_b0 = "[{}+:{}]";
    uStack_a8 = 8;
    local_b8 = local_1a8;
    local_c0 = local_218;
    local_d8 = "[{}+:{}]";
    uStack_d0 = 8;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RSI,x);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RSI,x);
    local_e0 = local_108;
    local_e8 = 0xdd;
    fmt_00.size_ = in_stack_ffffffffffffffc8;
    fmt_00.data_ = in_stack_ffffffffffffffc0;
    args_00.field_1.values_ = in_stack_ffffffffffffffb8.values_;
    args_00.desc_ = in_stack_ffffffffffffffb0;
    ::fmt::v11::vformat_abi_cxx11_(fmt_00,args_00);
  }
  else {
    local_120 = "[{}-:{}]";
    uStack_118 = 8;
    local_128 = local_1a8;
    local_130 = local_218;
    local_148 = "[{}-:{}]";
    uStack_140 = 8;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RSI,x);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_RSI,x);
    local_150 = local_178;
    local_158 = 0xdd;
    fmt_01.size_ = in_stack_ffffffffffffffc8;
    fmt_01.data_ = in_stack_ffffffffffffffc0;
    args_01.field_1.values_ = in_stack_ffffffffffffffb8.values_;
    args_01.desc_ = in_stack_ffffffffffffffb0;
    ::fmt::v11::vformat_abi_cxx11_(fmt_01,args_01);
  }
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return x;
}

Assistant:

std::string toString() const override {
        std::string left;
        if (leftIndexIsConstant()) {
            left = leftIndex.toString();
        }
        else {
            left = expr.left().syntax->toString();
        }
        std::string right;
        if (rightIndexIsConstant()) {
            right = rightIndex.toString();
        }
        else {
            right = expr.right().syntax->toString();
        }
        switch (expr.getSelectionKind()) {
            case ast::RangeSelectionKind::Simple:
                return fmt::format("[{}:{}]", left, right);
            case ast::RangeSelectionKind::IndexedUp:
                return fmt::format("[{}+:{}]", left, right);
            case ast::RangeSelectionKind::IndexedDown:
                return fmt::format("[{}-:{}]", left, right);
            default:
                SLANG_UNREACHABLE;
        }
    }